

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

Token * __thiscall enact::Lexer::string(Token *__return_storage_ptr__,Lexer *this)

{
  bool bVar1;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  undefined4 local_74;
  string local_70;
  char local_4d;
  char c;
  byte local_39;
  string local_38 [7];
  bool inEscapeSequence;
  string value;
  Lexer *this_local;
  
  value.field_2._8_8_ = this;
  std::__cxx11::string::string(local_38);
  local_39 = 0;
LAB_001382fc:
  do {
    bVar1 = isAtEnd(this);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_00138595:
      bVar1 = isAtEnd(this);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,"Unterminated string.",&local_c1);
        errorToken(__return_storage_ptr__,this,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::allocator<char>::~allocator(&local_c1);
      }
      else {
        advance(this);
        __return_storage_ptr__->type = STRING;
        std::__cxx11::string::string((string *)&__return_storage_ptr__->lexeme,local_38);
        __return_storage_ptr__->line = this->m_line;
        __return_storage_ptr__->col = this->m_col;
      }
LAB_001386a8:
      local_74 = 1;
      std::__cxx11::string::~string(local_38);
      return __return_storage_ptr__;
    }
    local_4d = peek(this);
    if ((local_39 & 1) == 0) {
      if (local_4d == '\"') goto LAB_00138595;
      if (local_4d == '\\') {
        local_39 = 1;
        advance(this);
        goto LAB_001382fc;
      }
      std::__cxx11::string::push_back((char)local_38);
    }
    else {
      if (local_4d == '\"') {
        std::__cxx11::string::push_back((char)local_38);
      }
      else {
        if (local_4d == '(') {
          advance(this);
          std::__cxx11::string::string((string *)&local_70,local_38);
          interpolationStart(__return_storage_ptr__,this,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          goto LAB_001386a8;
        }
        if (local_4d == '\\') {
          std::__cxx11::string::push_back((char)local_38);
        }
        else if (local_4d == 'n') {
          std::__cxx11::string::push_back((char)local_38);
        }
        else if (local_4d == 'r') {
          std::__cxx11::string::push_back((char)local_38);
        }
        else {
          if (local_4d != 't') {
            advance(this);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_98,"Unrecognised escape sequence.",&local_99);
            errorToken(__return_storage_ptr__,this,&local_98);
            std::__cxx11::string::~string((string *)&local_98);
            std::allocator<char>::~allocator(&local_99);
            goto LAB_001386a8;
          }
          std::__cxx11::string::push_back((char)local_38);
        }
      }
      local_39 = 0;
    }
    advance(this);
  } while( true );
}

Assistant:

Token Lexer::string() {
        std::string value;
        bool inEscapeSequence = false;
        while (!isAtEnd()) {
            const char c = peek();

            if (inEscapeSequence) {
                switch (c) {
                    case 'n':
                        value.push_back('\n');
                        break;
                    case 'r':
                        value.push_back('\r');
                        break;
                    case 't':
                        value.push_back('\t');
                        break;
                    case '\\':
                        value.push_back('\\');
                        break;
                    case '"':
                        value.push_back('"');
                        break;
                    case '(':
                        // Eat the '('
                        advance();
                        return interpolationStart(std::move(value));
                    default:
                        advance();
                        return errorToken("Unrecognised escape sequence.");
                }

                inEscapeSequence = false;
            } else {
                if (c == '"') break;
                if (c == '\\') {
                    inEscapeSequence = true;
                    advance();
                    continue;
                }

                value.push_back(c);
            }

            advance();
        }

        if (isAtEnd()) {
            return errorToken("Unterminated string.");
        }

        // Eat the close quote.
        advance();

        return Token{TokenType::STRING, value, m_line, m_col};
    }